

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_base_ident(lys_module *module,lys_ident *ident,char *basename,char *parent,
                      lys_type *type,unres_schema *unres)

{
  uint *puVar1;
  byte bVar2;
  ly_ctx *plVar3;
  lys_include *plVar4;
  lys_submodule *plVar5;
  int iVar6;
  lys_type_bit *plVar7;
  lys_tpdf *plVar8;
  char *pcVar9;
  lys_module *plVar10;
  char *pcVar11;
  uint uVar12;
  lys_ident *plVar13;
  char **ppcVar14;
  char *pcVar15;
  lys_ident *plVar16;
  int iVar17;
  ulong uVar18;
  char *local_90;
  lys_ident *target;
  ly_ctx *local_80;
  lys_module *local_78;
  lys_type *local_70;
  char *local_68;
  ly_ctx *local_60;
  char *local_58;
  unres_schema *local_50;
  lys_ident *local_48;
  uint16_t local_3a;
  char **local_38;
  
  local_58 = basename;
  if ((ident == (lys_ident *)0x0) != (type != (lys_type *)0x0)) {
    __assert_fail("(ident && !type) || (!ident && type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x166c,
                  "int resolve_base_ident(const struct lys_module *, struct lys_ident *, const char *, const char *, struct lys_type *, struct unres_schema *)"
                 );
  }
  plVar3 = module->ctx;
  local_50 = unres;
  if (type == (lys_type *)0x0) {
    ppcVar14 = &local_90;
    plVar8 = (lys_tpdf *)ident;
  }
  else {
    uVar12 = (type->info).bits.count + 1;
    (type->info).bits.count = uVar12;
    plVar7 = (lys_type_bit *)ly_realloc((type->info).bits.bit,(ulong)uVar12 << 3);
    (type->info).bits.bit = plVar7;
    if (plVar7 == (lys_type_bit *)0x0) {
      ly_log(plVar3,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_base_ident");
      return -1;
    }
    ppcVar14 = &plVar7->name + ((type->info).bits.count - 1);
    plVar8 = type->parent;
  }
  local_78 = plVar8->module;
  local_3a = plVar8->flags;
  local_70 = type;
  local_68 = parent;
  local_60 = plVar3;
  local_48 = ident;
  *ppcVar14 = (char *)0x0;
  pcVar15 = local_58;
  pcVar9 = strchr(local_58,0x3a);
  if (pcVar9 == (char *)0x0) {
    pcVar9 = pcVar15;
    iVar17 = 0;
  }
  else {
    iVar17 = (int)pcVar9 - (int)pcVar15;
    pcVar9 = pcVar9 + 1;
    pcVar11 = module->name;
    local_38 = ppcVar14;
    iVar6 = strncmp(pcVar15,pcVar11,(long)iVar17);
    ppcVar14 = local_38;
    pcVar15 = local_58;
    if ((iVar6 == 0) && (pcVar11[iVar17] == '\0')) {
      iVar17 = 0;
    }
  }
  pcVar11 = pcVar15;
  if (iVar17 == 0) {
    pcVar11 = (char *)0x0;
  }
  plVar10 = lyp_get_module(module,(char *)0x0,0,pcVar11,iVar17,0);
  if (plVar10 == (lys_module *)0x0) {
    ly_vlog(local_60,LYE_INMOD,LY_VLOG_NONE,(void *)0x0,pcVar15);
    return -1;
  }
  local_80 = plVar10->ctx;
  uVar18 = (ulong)plVar10->ident_size;
  if (uVar18 != 0) {
    plVar16 = plVar10->ident;
    do {
      iVar17 = strcmp(pcVar9,plVar16->name);
      if (iVar17 == 0) goto joined_r0x0011d61d;
      plVar16 = plVar16 + 1;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  target = (lys_ident *)(ulong)plVar10->inc_size;
  if ((lys_ident *)(ulong)plVar10->inc_size == (lys_ident *)0x0) {
    plVar16 = (lys_ident *)0x0;
  }
  else {
    local_38 = ppcVar14;
    plVar4 = plVar10->inc;
    plVar13 = (lys_ident *)0x0;
    do {
      plVar5 = plVar4[(long)plVar13].submodule;
      if (plVar5 == (lys_submodule *)0x0) break;
      uVar18 = (ulong)plVar5->ident_size;
      if (uVar18 != 0) {
        plVar16 = plVar5->ident;
        do {
          iVar17 = strcmp(pcVar9,plVar16->name);
          ppcVar14 = local_38;
          if (iVar17 == 0) goto joined_r0x0011d61d;
          plVar16 = plVar16 + 1;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      plVar13 = (lys_ident *)((long)&plVar13->name + 1);
    } while (plVar13 != target);
    plVar16 = (lys_ident *)0x0;
    ppcVar14 = local_38;
  }
LAB_0011d62c:
  plVar13 = local_48;
  plVar3 = local_80;
  iVar17 = 1;
  if (plVar16 == (lys_ident *)0x0) goto LAB_0011d66e;
  if ((ulong)local_50->count != 0) {
    uVar18 = 0;
    do {
      if (((lys_ident *)local_50->item[uVar18] == plVar16) &&
         (local_50->type[uVar18] == UNRES_IDENT)) {
        if ((char *)local_50->str_snode[uVar18] == local_48->name) {
          ly_vlog(local_80,LYE_INARG,LY_VLOG_NONE,(void *)0x0,pcVar9,"base");
          iVar17 = -1;
          ly_vlog(plVar3,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Circular reference of \"%s\" identity.",
                  pcVar9);
        }
        goto LAB_0011d66e;
      }
      uVar18 = uVar18 + 1;
    } while (local_50->count != uVar18);
  }
LAB_0011d668:
  plVar13 = local_48;
  *ppcVar14 = (char *)plVar16;
  iVar17 = 0;
LAB_0011d66e:
  if (iVar17 == 1) {
    ly_vlog(local_60,LYE_INRESOLV,LY_VLOG_NONE,(void *)0x0,local_68,local_58);
    iVar17 = 1;
    if (local_70 != (lys_type *)0x0) {
      puVar1 = &(local_70->info).bits.count;
      *puVar1 = *puVar1 - 1;
    }
  }
  else if (iVar17 == 0) {
    pcVar15 = *ppcVar14;
    if (pcVar15 == (char *)0x0) {
      __assert_fail("*ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1699,
                    "int resolve_base_ident(const struct lys_module *, struct lys_ident *, const char *, const char *, struct lys_type *, struct unres_schema *)"
                   );
    }
    if (plVar13 == (lys_ident *)0x0) {
      pcVar9 = "of type";
    }
    else {
      pcVar9 = plVar13->name;
    }
    iVar6 = lyp_check_status(local_3a,local_78,pcVar9,*(uint16_t *)(pcVar15 + 0x18),
                             *(lys_module **)(pcVar15 + 0x30),*(char **)pcVar15,(lys_node *)0x0);
    iVar17 = -(uint)(iVar6 != 0);
    if ((plVar13 != (lys_ident *)0x0) && (iVar6 == 0)) {
      plVar16 = (lys_ident *)*ppcVar14;
      bVar2 = plVar13->base_size;
      plVar13->base_size = bVar2 + 1;
      plVar13->base[bVar2] = plVar16;
      plVar10 = lys_main_module(local_78);
      iVar17 = 0;
      if ((plVar10->field_0x40 & 0x80) != 0) {
        resolve_identity_backlink_update(plVar13,(lys_ident *)*ppcVar14);
      }
    }
  }
  return iVar17;
joined_r0x0011d61d:
  if (local_48 != (lys_ident *)0x0) goto LAB_0011d62c;
  goto LAB_0011d668;
}

Assistant:

static int
resolve_base_ident(const struct lys_module *module, struct lys_ident *ident, const char *basename, const char *parent,
                   struct lys_type *type, struct unres_schema *unres)
{
    const char *name;
    int mod_name_len = 0, rc;
    struct lys_ident *target, **ret;
    uint16_t flags;
    struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;

    assert((ident && !type) || (!ident && type));

    if (!type) {
        /* have ident to resolve */
        ret = &target;
        flags = ident->flags;
        mod = ident->module;
    } else {
        /* have type to fill */
        ++type->info.ident.count;
        type->info.ident.ref = ly_realloc(type->info.ident.ref, type->info.ident.count * sizeof *type->info.ident.ref);
        LY_CHECK_ERR_RETURN(!type->info.ident.ref, LOGMEM(ctx), -1);

        ret = &type->info.ident.ref[type->info.ident.count - 1];
        flags = type->parent->flags;
        mod = type->parent->module;
    }
    *ret = NULL;

    /* search for the base identity */
    name = strchr(basename, ':');
    if (name) {
        /* set name to correct position after colon */
        mod_name_len = name - basename;
        name++;

        if (!strncmp(basename, module->name, mod_name_len) && !module->name[mod_name_len]) {
            /* prefix refers to the current module, ignore it */
            mod_name_len = 0;
        }
    } else {
        name = basename;
    }

    /* get module where to search */
    module = lyp_get_module(module, NULL, 0, mod_name_len ? basename : NULL, mod_name_len, 0);
    if (!module) {
        /* identity refers unknown data model */
        LOGVAL(ctx, LYE_INMOD, LY_VLOG_NONE, NULL, basename);
        return -1;
    }

    /* search in the identified module ... */
    rc = resolve_base_ident_sub(module, ident, name, unres, ret);
    if (!rc) {
        assert(*ret);

        /* check status */
        if (lyp_check_status(flags, mod, ident ? ident->name : "of type",
                             (*ret)->flags, (*ret)->module, (*ret)->name, NULL)) {
            rc = -1;
        } else if (ident) {
            ident->base[ident->base_size++] = *ret;
            if (lys_main_module(mod)->implemented) {
                /* in case of the implemented identity, maintain backlinks to it
                 * from the base identities to make it available when resolving
                 * data with the identity values (not implemented identity is not
                 * allowed as an identityref value). */
                resolve_identity_backlink_update(ident, *ret);
            }
        }
    } else if (rc == EXIT_FAILURE) {
        LOGVAL(ctx, LYE_INRESOLV, LY_VLOG_NONE, NULL, parent, basename);
        if (type) {
            --type->info.ident.count;
        }
    }

    return rc;
}